

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_19::BinaryReader::PrintError(BinaryReader *this,char *format,...)

{
  size_t offset;
  BinaryReaderDelegate *pBVar1;
  _func_int *p_Var2;
  long lVar3;
  FILE *__stream;
  Offset OVar4;
  ErrorLevel EVar5;
  Error *pEVar6;
  char in_AL;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  undefined8 in_RCX;
  undefined8 in_RDX;
  FILE **__s;
  size_t __maxlen;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 uStack_270;
  FILE *local_268;
  Offset local_260;
  char *local_258;
  ErrorLevel local_24c;
  Error *local_248;
  byte local_239;
  BinaryReader *local_238;
  byte local_229;
  undefined1 local_228 [16];
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined4 local_1f8;
  undefined4 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  byte local_161;
  undefined1 auStack_160 [7];
  bool handled;
  Location local_150;
  undefined1 local_130 [8];
  Error error;
  size_t length;
  char *buffer;
  char fixed_buf [128];
  va_list args_copy;
  undefined4 uStack_38;
  undefined4 uStack_34;
  va_list args;
  ErrorLevel error_level;
  char *format_local;
  BinaryReader *this_local;
  
  __s = &local_268;
  if (in_AL != '\0') {
    local_1f8 = in_XMM0_Da;
    local_1e8 = in_XMM1_Da;
    local_1d8 = in_XMM2_Qa;
    local_1c8 = in_XMM3_Qa;
    local_1b8 = in_XMM4_Qa;
    local_1a8 = in_XMM5_Qa;
    local_198 = in_XMM6_Qa;
    local_188 = in_XMM7_Qa;
  }
  local_229 = 0;
  if ((this->reading_custom_section_ & 1U) != 0) {
    local_229 = this->options_->fail_on_custom_section_error ^ 0xff;
  }
  args[0].reg_save_area._4_4_ = (ErrorLevel)((local_229 & 1) == 0);
  args[0].overflow_arg_area = local_228;
  args[0]._0_8_ = &stack0x00000008;
  uStack_34 = 0x30;
  uStack_38 = 0x10;
  fixed_buf[0x78] = '\x10';
  fixed_buf[0x79] = '\0';
  fixed_buf[0x7a] = '\0';
  fixed_buf[0x7b] = '\0';
  fixed_buf[0x7c] = '0';
  fixed_buf[0x7d] = '\0';
  fixed_buf[0x7e] = '\0';
  fixed_buf[0x7f] = '\0';
  uStack_270 = 0x1643937;
  local_238 = this;
  local_218 = in_RDX;
  local_210 = in_RCX;
  local_208 = in_R8;
  local_200 = in_R9;
  iVar7 = vsnprintf((char *)&buffer,0x80,format,&uStack_38);
  error.message.field_2._8_8_ = SEXT48(iVar7);
  length = (size_t)&buffer;
  if (0x80 < error.message.field_2._8_8_ + 1) {
    lVar3 = -(error.message.field_2._8_8_ + 0x10 & 0xfffffffffffffff0);
    __s = (FILE **)((long)&local_268 + lVar3);
    __maxlen = error.message.field_2._8_8_ + 1;
    *(undefined8 *)((long)&uStack_270 + lVar3) = 0x1643995;
    iVar7 = vsnprintf((char *)__s,__maxlen,format,fixed_buf + 0x78);
    error.message.field_2._8_8_ = SEXT48(iVar7);
    length = (size_t)__s;
  }
  local_24c = args[0].reg_save_area._4_4_;
  offset = (local_238->state_).offset;
  *(char *)((long)__s + -8) = -0x42;
  *(char *)((long)__s + -7) = '9';
  *(char *)((long)__s + -6) = 'd';
  *(char *)((long)__s + -5) = '\x01';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  Location::Location(&local_150,offset);
  *(char *)((long)__s + -8) = -0x2f;
  *(char *)((long)__s + -7) = '9';
  *(char *)((long)__s + -6) = 'd';
  *(char *)((long)__s + -5) = '\x01';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  string_view::string_view((string_view *)auStack_160,(char *)length);
  EVar5 = local_24c;
  ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)((long)__s + -0x10))->
  offset = (size_t)local_150.field_1.field_1.offset;
  *(undefined8 *)((long)__s + -8) = local_150.field_1._8_8_;
  *(char **)((long)__s + -0x20) = local_150.filename.data_;
  *(size_type *)((long)__s + -0x18) = local_150.filename.size_;
  local_248 = (Error *)local_130;
  *(char *)((long)__s + -0x28) = '\x14';
  *(char *)((long)__s + -0x27) = ':';
  *(char *)((long)__s + -0x26) = 'd';
  *(char *)((long)__s + -0x25) = '\x01';
  *(char *)((long)__s + -0x24) = '\0';
  *(char *)((long)__s + -0x23) = '\0';
  *(char *)((long)__s + -0x22) = '\0';
  *(char *)((long)__s + -0x21) = '\0';
  Error::Error((Error *)local_130,EVar5,*(Location *)((long)__s + -0x20),_auStack_160);
  pEVar6 = local_248;
  pBVar1 = local_238->delegate_;
  p_Var2 = pBVar1->_vptr_BinaryReaderDelegate[2];
  *(char *)((long)__s + -8) = '3';
  *(char *)((long)__s + -7) = ':';
  *(char *)((long)__s + -6) = 'd';
  *(char *)((long)__s + -5) = '\x01';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  uVar8 = (*p_Var2)(pBVar1,pEVar6);
  EVar5 = args[0].reg_save_area._4_4_;
  local_239 = (byte)uVar8;
  local_161 = local_239 & 1;
  if ((uVar8 & 1) == 0) {
    local_268 = _stderr;
    local_260 = (local_238->state_).offset;
    *(char *)((long)__s + -8) = -0x7f;
    *(char *)((long)__s + -7) = ':';
    *(char *)((long)__s + -6) = 'd';
    *(char *)((long)__s + -5) = '\x01';
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    pcVar9 = GetErrorLevelName(EVar5);
    OVar4 = local_260;
    __stream = local_268;
    local_258 = pcVar9;
    *(char *)((long)__s + -8) = -0x4c;
    *(char *)((long)__s + -7) = ':';
    *(char *)((long)__s + -6) = 'd';
    *(char *)((long)__s + -5) = '\x01';
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    fprintf(__stream,"%07zx: %s: %s\n",OVar4,pcVar9,length);
  }
  *(char *)((long)__s + -8) = -0x1e;
  *(char *)((long)__s + -7) = ':';
  *(char *)((long)__s + -6) = 'd';
  *(char *)((long)__s + -5) = '\x01';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  Error::~Error((Error *)local_130);
  return;
}

Assistant:

BinaryReader::PrintError(const char* format,
                                                       ...) {
  ErrorLevel error_level =
      reading_custom_section_ && !options_.fail_on_custom_section_error
          ? ErrorLevel::Warning
          : ErrorLevel::Error;

  WABT_SNPRINTF_ALLOCA(buffer, length, format);
  Error error(error_level, Location(state_.offset), buffer);
  bool handled = delegate_->OnError(error);

  if (!handled) {
    // Not great to just print, but we don't want to eat the error either.
    fprintf(stderr, "%07" PRIzx ": %s: %s\n", state_.offset,
            GetErrorLevelName(error_level), buffer);
  }
}